

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcrcell.c
# Opt level: O2

LispPTR gcreccell(LispPTR cell)

{
  ushort uVar1;
  DLword *pDVar2;
  DLword *pDVar3;
  uint uVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  LispPTR *pLVar7;
  LispPTR LVar8;
  uint uVar9;
  uint LAddr;
  uint uVar10;
  uint LAddr_00;
  uint uVar11;
  ulong local_17b8;
  short to_do_offset [1000];
  LispPTR to_do [1000];
  
  local_17b8 = 0;
  LAddr_00 = 0;
  uVar9 = 0xffffffff;
LAB_0011fbed:
  do {
    LAddr = LAddr_00;
    LAddr_00 = cell & 0xfffffffe;
    pLVar7 = NativeAligned4FromLAddr(LAddr_00);
    if ((cell & 0xfff0000) == 0x60000) {
      error("freeing an old atom??");
    }
    uVar1 = *(ushort *)((ulong)(cell >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2);
    uVar11 = uVar1 & 0x7ff;
    uVar4 = (uint)local_17b8;
    if (uVar11 - 0x40 < 10) {
      if (uVar9 == 0xffffffff) {
        LVar5 = reclaimcodeblock(LAddr_00);
LAB_0011fc56:
        if (LVar5 == 0) goto LAB_0011fd54;
LAB_0011fe50:
        if (LAddr == 0) {
          if (uVar4 == 0) {
            return 0;
          }
          local_17b8 = (ulong)(uVar4 - 1);
          cell = to_do[local_17b8];
          uVar9 = (uint)to_do_offset[local_17b8];
          todo_reads = todo_reads + 1;
          LAddr_00 = 0;
        }
        else {
          pLVar7 = NativeAligned4FromLAddr(LAddr);
          LAddr_00 = *pLVar7 & 0xfffffff;
          cell = LAddr;
          uVar9 = *pLVar7 >> 0x1c;
        }
        goto LAB_0011fbed;
      }
LAB_0011fd54:
      pDVar2 = DTDspace;
      uVar10 = uVar11 << 5;
      LVar5 = *(LispPTR *)((long)DTDspace + (ulong)uVar11 * 4 + (ulong)uVar10 + 0x14);
      if (uVar9 != 0xffffffff) {
        do {
          LVar5 = cdr(LVar5);
          LVar6 = car(LVar5);
        } while ((LVar6 & 0xffff) != uVar9 * 2);
      }
      do {
        if (LVar5 == 0) {
          LVar6 = 0;
          goto LAB_0011fe24;
        }
        LVar6 = car(LVar5);
        LVar5 = cdr(LVar5);
        pDVar3 = MDStypetbl;
        LVar8 = (LVar6 & 0xffff) + LAddr_00;
        pLVar7 = NativeAligned4FromLAddr(LVar8);
        LVar6 = 0;
        if ((-1 < *(short *)((ulong)(*pLVar7 >> 8 & 0xffffe) + (long)pDVar3 ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          pLVar7 = NativeAligned4FromLAddr(LVar8);
          LVar6 = rec_htfind(*pLVar7 & 0xfffffff,1);
        }
      } while (LVar6 == 0);
      if (LVar5 == 0) {
LAB_0011fe24:
        pLVar7 = NativeAligned4FromLAddr(LAddr_00);
        *pLVar7 = *(LispPTR *)((long)pDVar2 + (ulong)(uVar11 * 2) * 2 + (ulong)uVar10 + 8);
        *(LispPTR *)((long)pDVar2 + (ulong)(uVar11 * 2) * 2 + (ulong)uVar10 + 8) = cell & 0xffffffe;
LAB_0011fe47:
        LAddr_00 = LAddr;
        if (LVar6 == 0) goto LAB_0011fe50;
      }
      else {
        LVar8 = car(LVar5);
        if ((LVar8 & 0xfffe) < 0x1e) {
          pLVar7 = NativeAligned4FromLAddr(LAddr_00);
          *pLVar7 = *pLVar7 & 0xf0000000 | LAddr & 0xfffffff;
          LVar5 = car(LVar5);
          *pLVar7 = *pLVar7 & 0xfffffff | (LVar5 & 0xfffffffe) << 0x1b;
        }
        else if (uVar4 < 1000) {
          if (0xfffffff < cell) {
            error("illegal ptr in addtodo");
          }
          to_do[local_17b8] = LAddr_00;
          LVar5 = car(LVar5);
          to_do_offset[local_17b8] = (short)((LVar5 & 0xffff) >> 1);
          todo_uses = todo_uses + 1;
          local_17b8 = (ulong)(uVar4 + 1);
          LAddr_00 = LAddr;
        }
        else {
          todo_misses = todo_misses + 1;
          LAddr_00 = LAddr;
        }
      }
    }
    else {
      if ((uVar1 & 0x7ff) == 0) {
        if (uVar9 == 0xffffffff) {
          LVar5 = reclaimarrayblock(LAddr_00);
          goto LAB_0011fc56;
        }
        goto LAB_0011fd54;
      }
      if (uVar11 == 10) {
        if (uVar9 == 0xffffffff) {
          LVar5 = releasingvmempage(LAddr_00);
          goto LAB_0011fc56;
        }
        goto LAB_0011fd54;
      }
      if (uVar11 == 8) {
        if (uVar9 == 0xffffffff) {
          LVar5 = reclaimstackp(LAddr_00);
          goto LAB_0011fc56;
        }
        goto LAB_0011fd54;
      }
      if (uVar11 != 5) goto LAB_0011fd54;
      uVar11 = *pLVar7;
      LVar5 = uVar11;
      if (uVar11 < 0x10000000) {
        freelistcell(LAddr_00);
        pLVar7 = NativeAligned4FromLAddr(uVar11);
        LVar5 = *pLVar7;
        LAddr_00 = uVar11;
      }
      pDVar2 = MDStypetbl;
      if (((uVar9 != 0xffffffff) ||
          (LVar6 = car(LAddr_00), *(short *)((ulong)(pDVar2 + (LVar6 >> 9)) ^ 2) < 0)) ||
         (*GcDisabled_word == 0x4c)) {
LAB_0011fcb8:
        pDVar2 = MDStypetbl;
        LVar8 = cdr(LAddr_00);
        LVar6 = 0;
        if ((-1 < *(short *)((ulong)(pDVar2 + (LVar8 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
          LVar6 = cdr(LAddr_00);
          LVar6 = rec_htfind(LVar6,1);
        }
        if (-1 < (int)LVar5) {
          freelistcell((LVar5 >> 0x1b & 0xe) + LAddr_00);
        }
        freelistcell(LAddr_00);
        goto LAB_0011fe47;
      }
      LVar6 = car(LAddr_00);
      LVar6 = rec_htfind(LVar6,1);
      if (LVar6 == 0) goto LAB_0011fcb8;
      *pLVar7 = LVar5 & 0xf0000000 | LAddr & 0xfffffff;
    }
    cell = LVar6;
    uVar9 = 0xffffffff;
    if ((-1 < *(short *)((ulong)(LVar6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
       (uVar9 = 0xffffffff, *GcDisabled_word != 0x4c)) {
      rec_htfind(LVar6,0);
      uVar9 = 0xffffffff;
    }
  } while( true );
}

Assistant:

LispPTR gcreccell(LispPTR cell) {
  ConsCell *ptr;
  struct dtd *typdtd;
  DLword typ;
  LispPTR tmpptr, donext, tmpcell, val;
  LispPTR ptrfield, carfield;
  int index, code;
  LispPTR *field;

#ifdef NEWCDRCODING
  LispPTR to_do[TODO_LIMIT];      /* table of pointers to follow, since Cdr coding lost */
  short to_do_offset[TODO_LIMIT]; /* offset in datatype */
  unsigned do_count = 0;          /* counter of entries in to_do table */
#endif                            /* NEWCDRCODING */

  val = NIL;
  tmpptr = cell;
  index = -1;
  donext = NIL;
lp:
  ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr & -2);
/* # ifdef CHECK
  if (refcnt(tmpptr) != 1) error("reclaiming cell w/refcnt not 1");
 # endif
*/
#ifdef DEBUG
  if (tmpptr & 1) error("Reclaiming cell pointer with low bit 1.");
#else
  tmpptr &= -2; /* turn off low bit of pointer, so we never reclaim odd'ns */
#endif

  if ((tmpptr & 0x0FFF0000) == 0x60000) error("freeing an old atom??");

  typ = GetTypeNumber(tmpptr);
#ifdef DEBUG
  if (typ == 6) printf("Reclaiming array ptr 0x%x.\n", tmpptr);
#endif
  switch (typ) {
    case TYPE_LISTP: {
      if ((code = ptr->cdr_code) == CDR_INDIRECT) /* indirect */
      {
        tmpcell = ptr->car_field; /* Monitor */
        freelistcell(tmpptr);
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpcell);
        tmpptr = tmpcell;
        code = ptr->cdr_code;
      }
      if (index != -1) /* car part */
        index = -1;
      else {
        REC_GCLOOKUPV(car(tmpptr), DELREF, val);
        if (val != NIL) {
          ptr->car_field = donext;
          ptr->cdr_code = code;
          donext = tmpptr;
          goto doval;
        }
      }
      REC_GCLOOKUPV(cdr(tmpptr), DELREF, val);
      if (code <= CDR_MAXINDIRECT) {
#ifdef NEWCDRCODING
        tmpcell = tmpptr + ((code - CDR_INDIRECT) << 1);
#else
        tmpcell = POINTER_PAGEBASE(tmpptr) + ((code - CDR_INDIRECT) << 1);
#endif /* NEWCDRCODING */
        freelistcell(tmpcell);
      }
      freelistcell(tmpptr);
      goto doval;
    }
    case TYPE_ARRAYBLOCK:
      if ((index == -1) && reclaimarrayblock(tmpptr))
        goto trynext;
      else
        break;
    case TYPE_STACKP:
      if ((index == -1) && reclaimstackp(tmpptr)) goto trynext;
      break;
    case TYPE_VMEMPAGEP:
      if ((index == -1) && releasingvmempage(tmpptr)) {
        goto trynext;
      } else
        break;
    case TYPE_CODEHUNK1:
    case TYPE_CODEHUNK2:
    case TYPE_CODEHUNK3:
    case TYPE_CODEHUNK4:
    case TYPE_CODEHUNK5:
    case TYPE_CODEHUNK6:
    case TYPE_CODEHUNK7:
    case TYPE_CODEHUNK8:
    case TYPE_CODEHUNK9:
    case TYPE_CODEHUNK10:
      if ((index == -1) && reclaimcodeblock(tmpptr))
        goto trynext;
      else
        break;
    default:;
  }
normal:
  typdtd = (struct dtd *)GetDTD(typ);
  ptrfield = typdtd->dtd_ptrs;
  if (index != -1) {
    index = (index << 1);
    ptrfield = cdr(ptrfield);
    while ((car(ptrfield) & 0x0ffff) != index) ptrfield = cdr(ptrfield);
    index = -1;
  }
  while (ptrfield != NIL) {
    carfield = car(ptrfield);
    ptrfield = cdr(ptrfield);
    carfield &= 0x0ffff;
    REC_GCLOOKUPV((POINTERMASK & *(LispPTR *)NativeAligned4FromLAddr(tmpptr + carfield)), DELREF, val);
#ifndef NEWCDRCODING
    if (val != NIL) {
      if (ptrfield != NIL) {
        ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
        ptr->car_field = donext;
        ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
        donext = tmpptr;
        goto doval;
      } else
        goto addtofreelist;
    }
#else
    if (val != NIL) {
      if (ptrfield != NIL) {
        if ((carfield = car(ptrfield) & 0x0ffff) >> 1 < 15) {
          ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
          ptr->car_field = donext;
          ptr->cdr_code = ((car(ptrfield) & 0x0ffff) >> 1);
          donext = tmpptr;
          goto doval;
        } else {
          ADD_TO_DO(tmpptr, (car(ptrfield) & 0xffff) >> 1);
          goto doval;
        }
      } else
        goto addtofreelist;
    }
#endif /* NEWCDRCODING */
  }
addtofreelist:
  field = (LispPTR *)NativeAligned4FromLAddr(tmpptr);
  *field = typdtd->dtd_free;
  typdtd->dtd_free = tmpptr & POINTERMASK;
#ifdef DTDDEBUG
  check_dtd_chain(GetTypeNumber(tmpptr & POINTERMASK));
#endif

/******************************/
/*								*/
/*  Freeing one cell made another cell's refcnt = 0. */
/*  ADDREF the second cell (to remove it from the GC table) */
/*  and reclaim it.				*/
/************************************************************/
doval:
  if (val != NIL) {
    tmpptr = val;
    REC_GCLOOKUP(tmpptr, ADDREF);
    /*	GCLOOKUP(0x8000, ADDREF,tmpptr); */
    val = NIL;
    goto lp;
  }

/***************************************************************/
/*									*/
/*  Finished freeing the main cell, but we may have saved other */
/*  cells whose refcnt's went to 0 along the way.  This is      */
/*  where we work down the list of saved items to free.         */
/*									*/
/****************************************************************/
trynext:
  if (donext != NIL) {
    tmpptr = donext;
    ptr = (ConsCell *)NativeAligned4FromLAddr(tmpptr);
    donext = (LispPTR)ptr->car_field;
    index = ptr->cdr_code;
    goto lp;
  }
#ifdef NEWCDRCODING
  if (do_count) /* If there are other cells to collect */
  {
    do_count--;
    tmpptr = to_do[do_count];
    index = to_do_offset[do_count];
    todo_reads++;
    /*REC_GCLOOKUP(tmpptr, ADDREF); */
    goto lp;
  }
#endif /*NEWCDRCODING */
  return (NIL);
}